

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint *puVar1;
  HttpServer *pHVar2;
  PromiseFulfiller<void> *pPVar3;
  PromiseNode *pPVar4;
  Disposer *pDVar5;
  undefined1 local_11;
  
  pHVar2 = this->server;
  puVar1 = &pHVar2->connectionCount;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) &&
     ((pHVar2->zeroConnectionsFulfiller).ptr.ptr != (PromiseFulfiller<void> *)0x0)) {
    pPVar3 = (pHVar2->zeroConnectionsFulfiller).ptr.ptr;
    (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,&local_11);
  }
  if (((this->webSocketError).ptr.isSet == true) &&
     (pPVar4 = (this->webSocketError).ptr.field_1.value.super_PromiseBase.node.ptr,
     pPVar4 != (PromiseNode *)0x0)) {
    (this->webSocketError).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar5 = (this->webSocketError).ptr.field_1.value.super_PromiseBase.node.disposer;
    (**pDVar5->_vptr_Disposer)
              (pDVar5,(_func_int *)
                      ((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2]));
  }
  pPVar4 = (this->httpOutput).writeQueue.super_PromiseBase.node.ptr;
  if (pPVar4 != (PromiseNode *)0x0) {
    (this->httpOutput).writeQueue.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar5 = (this->httpOutput).writeQueue.super_PromiseBase.node.disposer;
    (**pDVar5->_vptr_Disposer)
              (pDVar5,(_func_int *)
                      ((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2]));
  }
  anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_MAYBE(f, server.zeroConnectionsFulfiller) {
        f->get()->fulfill();
      }
    }
  }